

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O0

void print_typeinfo(MOJOSHADER_symbolTypeInfo *info,uint indent)

{
  MOJOSHADER_symbolStructMember *pMVar1;
  uint indent_00;
  MOJOSHADER_symbolStructMember *member;
  int i;
  uint indent_local;
  MOJOSHADER_symbolTypeInfo *info_local;
  
  if (indent != 0) {
    do_indent(indent);
  }
  printf("      symbol class %s\n",print_typeinfo::symclasses[info->parameter_class]);
  if (indent != 0) {
    do_indent(indent);
  }
  printf("      symbol type %s\n",print_typeinfo::symtypes[info->parameter_type]);
  if (indent != 0) {
    do_indent(indent);
  }
  printf("      rows %u\n",(ulong)info->rows);
  if (indent != 0) {
    do_indent(indent);
  }
  printf("      columns %u\n",(ulong)info->columns);
  if (indent != 0) {
    do_indent(indent);
  }
  printf("      elements %u\n",(ulong)info->elements);
  if (info->member_count != 0) {
    if (indent != 0) {
      do_indent(indent);
    }
    printf("      MEMBERS:\n");
    for (member._0_4_ = 0; (uint)member < info->member_count; member._0_4_ = (uint)member + 1) {
      pMVar1 = info->members;
      if (indent != 0) {
        do_indent(indent);
      }
      printf("      MEMBERS:\n");
      indent_00 = indent + 1;
      if (indent_00 != 0) {
        do_indent(indent_00);
      }
      printf("      * %d: \"%s\"\n",(ulong)(uint)member,pMVar1[(int)(uint)member].name);
      print_typeinfo(&pMVar1[(int)(uint)member].info,indent_00);
    }
  }
  return;
}

Assistant:

static void print_typeinfo(const MOJOSHADER_symbolTypeInfo *info,
                           unsigned int indent)
{
    static const char *symclasses[] = {
        "scalar", "vector", "row-major matrix",
        "column-major matrix", "object", "struct"
    };

    static const char *symtypes[] = {
        "void", "bool", "int", "float", "string", "texture",
        "texture1d", "texture2d", "texture3d", "texturecube",
        "sampler", "sampler1d", "sampler2d", "sampler3d",
        "samplercube", "pixelshader", "vertexshader", "unsupported"
    };

    INDENT();
    printf("      symbol class %s\n", symclasses[info->parameter_class]);
    INDENT();
    printf("      symbol type %s\n", symtypes[info->parameter_type]);
    INDENT();
    printf("      rows %u\n", info->rows);
    INDENT();
    printf("      columns %u\n", info->columns);
    INDENT();
    printf("      elements %u\n", info->elements);

    if (info->member_count > 0)
    {
        int i;
        INDENT(); printf("      MEMBERS:\n");
        for (i = 0; i < info->member_count; i++)
        {
            const MOJOSHADER_symbolStructMember *member = &info->members[i];
            INDENT(); printf("      MEMBERS:\n");
            indent++;
            INDENT(); printf("      * %d: \"%s\"\n", i, member->name);
            print_typeinfo(&member->info, indent);
            indent--;
        } // for
    } // if
}